

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadGeometryVertexElement
          (OgreBinarySerializer *this,VertexData *dest)

{
  uint16_t uVar1;
  Logger *this_00;
  VertexElement element;
  VertexElement local_200;
  string local_1f0;
  string local_1d0;
  char *local_1b0 [4];
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  
  VertexElement::VertexElement(&local_200);
  local_200.source = Read<unsigned_short>(this);
  uVar1 = Read<unsigned_short>(this);
  local_200.type = (Type)uVar1;
  uVar1 = Read<unsigned_short>(this);
  local_200.semantic = (Semantic)uVar1;
  local_200.offset = Read<unsigned_short>(this);
  local_200.index = Read<unsigned_short>(this);
  this_00 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[22]>(&local_190,(char (*) [22])"    - Vertex element ");
  VertexElement::SemanticToString_abi_cxx11_(&local_1d0,&local_200);
  std::operator<<((ostream *)&local_190,(string *)&local_1d0);
  std::operator<<((ostream *)&local_190," of type ");
  VertexElement::TypeToString_abi_cxx11_(&local_1f0,&local_200);
  std::operator<<((ostream *)&local_190,(string *)&local_1f0);
  std::operator<<((ostream *)&local_190," index=");
  std::ostream::operator<<(&local_190,local_200.index);
  std::operator<<((ostream *)&local_190," source=");
  std::ostream::operator<<(&local_190,local_200.source);
  std::__cxx11::stringbuf::str();
  Logger::debug(this_00,local_1b0[0]);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  std::vector<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_>::push_back
            (&dest->vertexElements,&local_200);
  return;
}

Assistant:

void OgreBinarySerializer::ReadGeometryVertexElement(VertexData *dest)
{
    VertexElement element;
    element.source = Read<uint16_t>();
    element.type = static_cast<VertexElement::Type>(Read<uint16_t>());
    element.semantic = static_cast<VertexElement::Semantic>(Read<uint16_t>());
    element.offset = Read<uint16_t>();
    element.index = Read<uint16_t>();

    ASSIMP_LOG_DEBUG_F( "    - Vertex element ", element.SemanticToString(), " of type ",
        element.TypeToString(), " index=", element.index, " source=", element.source);

    dest->vertexElements.push_back(element);
}